

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covar.hpp
# Opt level: O2

void duckdb::CovarOperation::Combine<duckdb::CovarState,duckdb::CovarPopOperation>
               (CovarState *source,CovarState *target,AggregateInputData *param_3)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar2 = target->count;
  if (uVar2 != 0) {
    uVar3 = source->count;
    if (uVar3 != 0) {
      uVar1 = uVar3 + uVar2;
      auVar7._8_4_ = (int)(uVar2 >> 0x20);
      auVar7._0_8_ = uVar2;
      auVar7._12_4_ = 0x45300000;
      dVar4 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
      auVar9._8_4_ = (int)(uVar3 >> 0x20);
      auVar9._0_8_ = uVar3;
      auVar9._12_4_ = 0x45300000;
      dVar5 = (auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
      auVar10._8_4_ = (int)(uVar1 >> 0x20);
      auVar10._0_8_ = uVar1;
      auVar10._12_4_ = 0x45300000;
      auVar8._0_8_ = (auVar10._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      auVar6._0_8_ = dVar5 * source->meanx + dVar4 * target->meanx;
      auVar6._8_8_ = dVar5 * source->meany + dVar4 * target->meany;
      auVar8._8_8_ = auVar8._0_8_;
      auVar7 = divpd(auVar6,auVar8);
      target->co_moment =
           ((target->meany - source->meany) * (target->meanx - source->meanx) * dVar5 * dVar4) /
           auVar8._0_8_ + source->co_moment + target->co_moment;
      target->meanx = (double)auVar7._0_8_;
      target->meany = (double)auVar7._8_8_;
      target->count = uVar1;
    }
    return;
  }
  uVar2 = source->count;
  dVar4 = source->meanx;
  dVar5 = source->co_moment;
  target->meany = source->meany;
  target->co_moment = dVar5;
  target->count = uVar2;
  target->meanx = dVar4;
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (target.count == 0) {
			target = source;
		} else if (source.count > 0) {
			const auto count = target.count + source.count;
			D_ASSERT(count >= target.count); // This is a check that we are not overflowing
			const auto target_count = static_cast<double>(target.count);
			const auto source_count = static_cast<double>(source.count);
			const auto total_count = static_cast<double>(count);
			const auto meanx = (source_count * source.meanx + target_count * target.meanx) / total_count;
			const auto meany = (source_count * source.meany + target_count * target.meany) / total_count;

			//  Schubert and Gertz SSDBM 2018, equation 21
			const auto deltax = target.meanx - source.meanx;
			const auto deltay = target.meany - source.meany;
			target.co_moment =
			    source.co_moment + target.co_moment + deltax * deltay * source_count * target_count / total_count;
			target.meanx = meanx;
			target.meany = meany;
			target.count = count;
		}
	}